

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  undefined8 uVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  Allocator *pAVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  undefined8 *puVar22;
  Allocator *pAVar23;
  Allocator *pAVar24;
  ulong uVar25;
  long lVar26;
  int i;
  long lVar27;
  Allocator *pAVar28;
  ulong uVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float tmp [6] [3];
  Mat local_c8;
  undefined8 uStack_80;
  float fStack_78;
  undefined8 auStack_74 [8];
  
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elempack = 0;
  local_c8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.elemsize._4_4_ = (int)local_c8.refcount;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.c = local_c8.elempack;
  Mat::create(&local_c8,0x24,inch,outch,4,(Allocator *)0x0);
  if (0 < outch) {
    pvVar7 = kernel->data;
    uVar25 = 0;
    pAVar28 = (Allocator *)local_c8.data;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)uVar25;
        uVar29 = 0;
        pAVar24 = pAVar28;
        do {
          fVar1 = *(float *)((long)pvVar7 + uVar29 * 0x24 + (long)iVar18 * 4 + 0x18);
          fVar2 = *(float *)((long)pvVar7 + uVar29 * 0x24 + (long)iVar18 * 4 + 0x1c);
          fVar3 = *(float *)((long)pvVar7 + uVar29 * 0x24 + (long)iVar18 * 4 + 0x20);
          auVar10 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 + uVar29 * 0x24 + (long)iVar18 * 4)
                                         ),ZEXT416(*(uint *)((long)pvVar7 +
                                                            uVar29 * 0x24 + (long)iVar18 * 4 + 0x10)
                                                  ),0x10);
          auVar31 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 +
                                                   uVar29 * 0x24 + (long)iVar18 * 4 + 0xc)),
                                  ZEXT416(*(uint *)((long)pvVar7 +
                                                   uVar29 * 0x24 + (long)iVar18 * 4 + 4)),0x10);
          auVar11 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar7 +
                                                   uVar29 * 0x24 + (long)iVar18 * 4 + 8)),
                                  ZEXT416(*(uint *)((long)pvVar7 +
                                                   uVar29 * 0x24 + (long)iVar18 * 4 + 0x14)),0x10);
          lVar20 = 8;
          do {
            uVar5 = *(ulong *)((long)&DAT_00550358 + lVar20);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = uVar5;
            fVar12 = (float)uVar5;
            auVar33._0_4_ = auVar31._0_4_ * fVar12;
            fVar13 = (float)(uVar5 >> 0x20);
            auVar33._4_4_ = auVar31._4_4_ * fVar13;
            auVar33._8_4_ = auVar31._8_4_ * 0.0;
            auVar33._12_4_ = auVar31._12_4_ * 0.0;
            auVar33 = vshufps_avx(auVar33,auVar33,0xe1);
            fVar4 = *(float *)((long)&DAT_00550360 + lVar20);
            auVar34._0_4_ = auVar10._0_4_ * fVar12 + fVar4 * auVar11._0_4_ + auVar33._0_4_;
            auVar34._4_4_ = auVar10._4_4_ * fVar13 + fVar4 * auVar11._4_4_ + auVar33._4_4_;
            auVar34._8_4_ = auVar10._8_4_ * 0.0 + fVar4 * auVar11._8_4_ + auVar33._8_4_;
            auVar34._12_4_ = auVar10._12_4_ * 0.0 + fVar4 * auVar11._12_4_ + auVar33._12_4_;
            uVar6 = vmovlps_avx(auVar34);
            *(undefined8 *)((long)&uStack_80 + lVar20) = uVar6;
            auVar33 = vmovshdup_avx(auVar32);
            *(float *)((long)auStack_74 + lVar20 + -4) =
                 fVar2 * auVar33._0_4_ + fVar4 * fVar3 + fVar1 * fVar12;
            lVar20 = lVar20 + 0xc;
          } while (lVar20 != 0x50);
          lVar20 = 0;
          pAVar23 = pAVar24;
          do {
            fVar1 = *(float *)((long)auStack_74 + lVar20 * 0xc + -4);
            uVar6 = *(undefined8 *)((long)auStack_74 + lVar20 * 0xc);
            puVar22 = (undefined8 *)((long)&DAT_00550360 + 4);
            lVar27 = 0;
            do {
              auVar31._0_4_ = (float)*puVar22 * (float)uVar6;
              auVar31._4_4_ = (float)((ulong)*puVar22 >> 0x20) * (float)((ulong)uVar6 >> 0x20);
              auVar31._8_8_ = 0;
              auVar10 = vmovshdup_avx(auVar31);
              *(float *)((long)&pAVar23->_vptr_Allocator + lVar27 * 4) =
                   auVar31._0_4_ + fVar1 * *(float *)((long)puVar22 + -4) + auVar10._0_4_;
              lVar27 = lVar27 + 1;
              puVar22 = (undefined8 *)((long)puVar22 + 0xc);
            } while (lVar27 != 6);
            lVar20 = lVar20 + 1;
            pAVar23 = pAVar23 + 3;
          } while (lVar20 != 6);
          uVar29 = uVar29 + 1;
          pAVar24 = (Allocator *)
                    ((long)&pAVar24->_vptr_Allocator +
                    (long)local_c8.w *
                    CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        } while (uVar29 != (uint)inch);
      }
      uVar25 = uVar25 + 1;
      pAVar28 = (Allocator *)
                ((long)&pAVar28->_vptr_Allocator +
                local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
    } while (uVar25 != (uint)outch);
  }
  iVar18 = inch + 7;
  if (-1 < inch) {
    iVar18 = inch;
  }
  iVar19 = outch + 7;
  if (-1 < outch) {
    iVar19 = outch;
  }
  Mat::create(kernel_tm_pack8,iVar18 >> 3,0x24,iVar19 >> 3,0x100,0x40,(Allocator *)0x0);
  if (7 < outch) {
    iVar18 = kernel_tm_pack8->w;
    pvVar7 = kernel_tm_pack8->data;
    sVar8 = kernel_tm_pack8->elemsize;
    sVar9 = kernel_tm_pack8->cstep;
    uVar25 = 0;
    do {
      lVar27 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      lVar20 = (long)local_c8.w * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      pAVar28 = (Allocator *)((long)(_func_int ***)local_c8.data + lVar27 * uVar25);
      lVar30 = 0;
      do {
        if (7 < inch) {
          lVar15 = (long)pvVar7 + (long)iVar18 * sVar8 * lVar30 + (uVar25 >> 3) * sVar9 * sVar8;
          pAVar24 = pAVar28;
          lVar26 = 0;
          do {
            lVar21 = 0;
            pAVar23 = pAVar24;
            do {
              lVar16 = lVar15;
              lVar15 = 0;
              pAVar17 = pAVar23;
              do {
                *(undefined4 *)(lVar16 + lVar15) = *(undefined4 *)&pAVar17->_vptr_Allocator;
                pAVar17 = (Allocator *)((long)&pAVar17->_vptr_Allocator + lVar27);
                lVar15 = lVar15 + 4;
              } while (lVar15 != 0x20);
              lVar21 = lVar21 + 1;
              pAVar23 = (Allocator *)((long)&pAVar23->_vptr_Allocator + lVar20);
              lVar15 = lVar16 + 0x20;
            } while (lVar21 != 8);
            lVar21 = lVar26 + 0xf;
            pAVar24 = pAVar24 + lVar20;
            lVar15 = lVar16 + 0x20;
            lVar26 = lVar26 + 8;
          } while (lVar21 < inch);
        }
        lVar30 = lVar30 + 1;
        pAVar28 = (Allocator *)((long)&pAVar28->_vptr_Allocator + 4);
      } while (lVar30 != 0x24);
      uVar29 = uVar25 + 0xf;
      uVar25 = uVar25 + 8;
    } while (uVar29 < (uint)outch);
  }
  piVar14 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8_avx(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch);

    const float ktm[6][3] = {
        {1.0f / 4, 0.0f, 0.0f},
        {-1.0f / 6, -1.0f / 6, -1.0f / 6},
        {-1.0f / 6, 1.0f / 6, -1.0f / 6},
        {1.0f / 24, 1.0f / 12, 1.0f / 6},
        {1.0f / 24, -1.0f / 12, 1.0f / 6},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 8b-8a-inch/8a-36-outch/8b
    kernel_tm_pack8.create(inch / 8, 36, outch / 8, (size_t)4u * 64, 64);
    for (int q = 0; q + 7 < outch; q += 8)
    {
        Mat g0 = kernel_tm_pack8.channel(q / 8);

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}